

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtr_mgr.c
# Opt level: O1

int rtr_mgr_config_cmp(void *a,void *b)

{
  int iVar1;
  long in_FS_OFFSET;
  
  iVar1 = 1;
  if (*(byte *)((long)a + 0xc) <= *(byte *)((long)b + 0xc)) {
    iVar1 = -(uint)(*(byte *)((long)a + 0xc) < *(byte *)((long)b + 0xc));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

int rtr_mgr_config_cmp(const void *a, const void *b)
{
	const struct rtr_mgr_group *ar = a;
	const struct rtr_mgr_group *br = b;

	if (ar->preference > br->preference)
		return 1;
	else if (ar->preference < br->preference)
		return -1;
	return 0;
}